

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalNinjaGenerator::IsSingleConfigUtility
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *target)

{
  TargetType TVar1;
  string *__x;
  size_type sVar2;
  byte local_19;
  cmGeneratorTarget *target_local;
  cmGlobalNinjaGenerator *this_local;
  
  TVar1 = cmGeneratorTarget::GetType(target);
  local_19 = 0;
  if (TVar1 == UTILITY) {
    __x = cmGeneratorTarget::GetName_abi_cxx11_(target);
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this->PerConfigUtilityTargets,__x);
    local_19 = sVar2 != 0 ^ 0xff;
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool cmGlobalNinjaGenerator::IsSingleConfigUtility(
  cmGeneratorTarget const* target) const
{
  return target->GetType() == cmStateEnums::UTILITY &&
    !this->PerConfigUtilityTargets.count(target->GetName());
}